

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t do_clcl(CPUS390XState_conflict *env,uint64_t *src1,uint64_t *src1len,uint64_t *src3,
                uint64_t *src3len,uint16_t pad,uint64_t limit,int wordsize,uintptr_t ra)

{
  ulong uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  uint16_t uVar7;
  ulong uVar8;
  
  uVar5 = *src1len;
  uVar1 = *src3len;
  uVar8 = uVar1;
  if (uVar1 < uVar5) {
    uVar8 = uVar5;
  }
  check_alignment(env,uVar1 | uVar5,wordsize,ra);
  if (uVar8 == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = limit;
    if (uVar8 < limit) {
      uVar4 = uVar8;
    }
    uVar3 = (uint)(limit < uVar8) * 3;
    uVar5 = (ulong)(uint)wordsize;
    for (lVar6 = -uVar4; lVar6 != 0; lVar6 = lVar6 + uVar5) {
      uVar7 = pad;
      if (*src1len != 0) {
        uVar4 = cpu_ldusize_data_ra(env,*src1,wordsize,ra);
        uVar7 = (uint16_t)uVar4;
      }
      uVar2 = pad;
      if (*src3len != 0) {
        uVar4 = cpu_ldusize_data_ra(env,*src3,wordsize,ra);
        uVar2 = (uint16_t)uVar4;
      }
      if (uVar7 != uVar2) {
        return 2 - (uVar7 < uVar2);
      }
      if (*src1len != 0) {
        *src1 = *src1 + uVar5;
        *src1len = *src1len - uVar5;
      }
      if (*src3len != 0) {
        *src3 = *src3 + uVar5;
        *src3len = *src3len - uVar5;
      }
    }
  }
  return uVar3;
}

Assistant:

static inline uint32_t do_clcl(CPUS390XState *env,
                               uint64_t *src1, uint64_t *src1len,
                               uint64_t *src3, uint64_t *src3len,
                               uint16_t pad, uint64_t limit,
                               int wordsize, uintptr_t ra)
{
    uint64_t len = MAX(*src1len, *src3len);
    uint32_t cc = 0;

    check_alignment(env, *src1len | *src3len, wordsize, ra);

    if (!len) {
        return cc;
    }

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  */
    if (len > limit) {
        len = limit;
        cc = 3;
    }

    for (; len; len -= wordsize) {
        uint16_t v1 = pad;
        uint16_t v3 = pad;

        if (*src1len) {
            v1 = cpu_ldusize_data_ra(env, *src1, wordsize, ra);
        }
        if (*src3len) {
            v3 = cpu_ldusize_data_ra(env, *src3, wordsize, ra);
        }

        if (v1 != v3) {
            cc = (v1 < v3) ? 1 : 2;
            break;
        }

        if (*src1len) {
            *src1 += wordsize;
            *src1len -= wordsize;
        }
        if (*src3len) {
            *src3 += wordsize;
            *src3len -= wordsize;
        }
    }

    return cc;
}